

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O3

void __thiscall QJsonDocument::setArray(QJsonDocument *this,QJsonArray *array)

{
  Type TVar1;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var2;
  QCborContainerPrivate *pQVar3;
  Type TVar4;
  pointer __p;
  pointer __p_00;
  long in_FS_OFFSET;
  QJsonValue QStack_68;
  QCborValue local_50;
  __uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> local_38;
  QCborContainerPrivate *local_30;
  Type local_28;
  undefined4 uStack_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d)._M_t.
      super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
      super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl ==
      (QJsonDocumentPrivate *)0x0) {
    __p_00 = (pointer)operator_new(0x18);
    *(undefined8 *)&(__p_00->value).t = 0;
    (__p_00->value).n = 0;
    (__p_00->value).container = (QCborContainerPrivate *)0x0;
    (__p_00->value).t = Undefined;
    local_38._M_t.
    super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
    super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
         (tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)
         (_Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>)0x0;
    std::__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::reset
              ((__uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               this,__p_00);
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::~unique_ptr
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               &local_38);
  }
  QJsonValue::QJsonValue(&QStack_68,array);
  QCborValue::fromJsonValue(&local_50,&QStack_68);
  TVar4 = local_50.t;
  pQVar3 = local_50.container;
  _Var2._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  local_50.container = (QCborContainerPrivate *)0x0;
  local_50.t = Undefined;
  local_38._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       *(tuple<QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_> *)
        &(_Var2._M_head_impl)->value;
  ((_Var2._M_head_impl)->value).n = local_50.n;
  local_30 = *(QCborContainerPrivate **)((long)&(_Var2._M_head_impl)->value + 8);
  *(QCborContainerPrivate **)((long)&(_Var2._M_head_impl)->value + 8) = pQVar3;
  TVar1 = *(Type *)((long)&(_Var2._M_head_impl)->value + 0x10);
  *(Type *)((long)&(_Var2._M_head_impl)->value + 0x10) = TVar4;
  _local_28 = CONCAT44(0xaaaaaaaa,TVar1);
  QCborValue::~QCborValue((QCborValue *)&local_38);
  QCborValue::~QCborValue((QCborValue *)&local_50);
  QJsonValue::~QJsonValue(&QStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonDocument::setArray(const QJsonArray &array)
{
    if (!d)
        d = std::make_unique<QJsonDocumentPrivate>();

    d->value = QCborValue::fromJsonValue(array);
}